

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::AndroidExtensionPackES31ATests::init
          (AndroidExtensionPackES31ATests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  char *pcVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  TestNode *pTVar4;
  int *value;
  long lVar5;
  bool bVar6;
  string name;
  string description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  TestContext *local_88;
  undefined8 uStack_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"limits",
             "Implementation limits");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 4;
  value = &init::limits[0].limit;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar2 = ((anon_struct_16_3_5e4bdd50 *)(value + -3))->name;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_c8,"Check ");
    std::operator+(&local_a8,&local_50,pcVar2);
    std::operator+(&name,&local_a8," is at least ");
    de::toString<int>(&local_70,value);
    std::operator+(&description,&name,&local_70);
    local_88 = *(TestContext **)(value + -1);
    uStack_80 = 0;
    anon_unknown_1::ExtensionPackTestCase::ExtensionPackTestCase
              ((ExtensionPackTestCase *)pTVar4,pCVar1,pcVar2,description._M_dataplus._M_p);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_01e5a088;
    pTVar4[1].m_testCtx = local_88;
    tcu::TestNode::addChild(pTVar3,pTVar4);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_c8);
    value = value + 4;
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"extensions",
             "Required extensions");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (lVar5 = 0; lVar5 != 0xa0; lVar5 = lVar5 + 8) {
    pcVar2 = *(char **)((long)init::subExtensions + lVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&description,pcVar2 + 3,(allocator<char> *)&local_a8);
    de::toLower(&name,&description);
    std::__cxx11::string::~string((string *)&description);
    std::operator+(&local_a8,"Check that extension ",&name);
    std::operator+(&description,&local_a8," is supported if extension pack is supported");
    std::__cxx11::string::~string((string *)&local_a8);
    pTVar4 = (TestNode *)operator_new(0x98);
    anon_unknown_1::ExtensionPackTestCase::ExtensionPackTestCase
              ((ExtensionPackTestCase *)pTVar4,(this->super_TestCaseGroup).m_context,
               name._M_dataplus._M_p,description._M_dataplus._M_p);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__SubExtensionCase_01e5a128;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pTVar4[1].m_testCtx,pcVar2,(allocator<char> *)&local_a8);
    tcu::TestNode::addChild(pTVar3,pTVar4);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&name);
  }
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)&description,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"shaders",
             "Shader tests");
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name,
             (ShaderLibrary *)&description,"shaders/es31/android_extension_pack.test");
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es31",
             "GLSL ES 3.1 Shader tests",
             (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name);
  tcu::TestNode::addChild(pTVar3,pTVar4);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            ((_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name,
             (ShaderLibrary *)&description,"shaders/es32/android_extension_pack.test");
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es32",
             "GLSL ES 3.2 Shader tests",
             (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name);
  tcu::TestNode::addChild(pTVar3,pTVar4);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            ((_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&description);
  return extraout_EAX;
}

Assistant:

void AndroidExtensionPackES31ATests::init (void)
{
	// .limits
	{
		static const struct
		{
			const char*	name;
			glw::GLenum	target;
			int			limit;
		} limits[] =
		{
			{
				"max_fragment_atomic_counter_buffers",
				GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS,
				1
			},
			{
				"max_fragment_atomic_counters",
				GL_MAX_FRAGMENT_ATOMIC_COUNTERS,
				8
			},
			{
				"max_fragment_image_uniforms",
				GL_MAX_FRAGMENT_IMAGE_UNIFORMS,
				4
			},
			{
				"max_fragment_shader_storage_blocks",
				GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS,
				4
			},
		};

		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "limits", "Implementation limits");
		addChild(group);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(limits); ++ndx)
			group->addChild(new ImplementationLimitCase(m_context,
														limits[ndx].name,
														(std::string() + "Check " + limits[ndx].name + " is at least " + de::toString(limits[ndx].limit)).c_str(),
														limits[ndx].target,
														limits[ndx].limit));
	}

	// .extensions
	{
		static const char* const subExtensions[] =
		{
			"GL_KHR_debug",
			"GL_KHR_texture_compression_astc_ldr",
			"GL_KHR_blend_equation_advanced",
			"GL_OES_sample_shading",
			"GL_OES_sample_variables",
			"GL_OES_shader_image_atomic",
			"GL_OES_shader_multisample_interpolation",
			"GL_OES_texture_stencil8",
			"GL_OES_texture_storage_multisample_2d_array",
			"GL_EXT_copy_image",
			"GL_EXT_draw_buffers_indexed",
			"GL_EXT_geometry_shader",
			"GL_EXT_gpu_shader5",
			"GL_EXT_primitive_bounding_box",
			"GL_EXT_shader_io_blocks",
			"GL_EXT_tessellation_shader",
			"GL_EXT_texture_border_clamp",
			"GL_EXT_texture_buffer",
			"GL_EXT_texture_cube_map_array",
			"GL_EXT_texture_sRGB_decode",
		};

		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "extensions", "Required extensions");
		addChild(group);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(subExtensions); ++ndx)
		{
			const std::string name			= genExtensionTestName(subExtensions[ndx]);
			const std::string description	= "Check that extension " + name + " is supported if extension pack is supported";
			group->addChild(new SubExtensionCase(m_context, name.c_str(), description.c_str(), subExtensions[ndx]));
		}
	}

	// .shaders
	{
		gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		tcu::TestCaseGroup* const			group			= new tcu::TestCaseGroup(m_testCtx, "shaders", "Shader tests");

		{
			const std::vector<tcu::TestNode*>&	children		= shaderLibrary.loadShaderFile("shaders/es31/android_extension_pack.test");
			tcu::TestCaseGroup* const			groupES31		= new tcu::TestCaseGroup(m_testCtx, "es31", "GLSL ES 3.1 Shader tests", children);

			group->addChild(groupES31);
		}

		{
			const std::vector<tcu::TestNode*>&	children		= shaderLibrary.loadShaderFile("shaders/es32/android_extension_pack.test");
			tcu::TestCaseGroup* const			groupES32		= new tcu::TestCaseGroup(m_testCtx, "es32", "GLSL ES 3.2 Shader tests", children);

			group->addChild(groupES32);
		}

		addChild(group);
	}
}